

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_parse_result * __thiscall
pugi::xml_document::load
          (xml_parse_result *__return_storage_ptr__,xml_document *this,
          basic_istream<wchar_t,_std::char_traits<wchar_t>_> *stream,uint options)

{
  xml_document_struct *doc;
  undefined *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  void *contents;
  undefined8 *puVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 *puVar9;
  ulong uVar10;
  void *__dest;
  undefined8 *puVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  xml_parse_status local_50;
  
  _destroy(this);
  _create(this);
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) != 0) {
    __return_storage_ptr__->encoding = encoding_auto;
    __return_storage_ptr__->status = status_io_error;
    goto LAB_00122426;
  }
  doc = (xml_document_struct *)(this->super_xml_node)._root;
  lVar4 = std::wistream::tellg();
  if (lVar4 < 0) {
    puVar11 = (undefined8 *)0x0;
    std::wios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + (int)stream);
    uVar3 = *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
    puVar9 = (undefined8 *)0x0;
    uVar10 = 0;
LAB_00122265:
    if ((uVar3 & 2) == 0) {
      puVar6 = (undefined8 *)
               (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(0x7fe8);
      local_50 = status_out_of_memory;
      if (puVar6 == (undefined8 *)0x0) {
LAB_001223b8:
        local_50 = status_out_of_memory;
        uVar10 = 0;
        contents = (void *)0x0;
        bVar12 = false;
      }
      else {
        *puVar6 = 0;
        puVar6[1] = 0;
        puVar2 = puVar6;
        if (puVar9 != (undefined8 *)0x0) {
          *puVar9 = puVar6;
          puVar2 = puVar11;
        }
        puVar11 = puVar2;
        std::wistream::read((wchar_t *)stream,(long)(puVar6 + 2));
        contents = (void *)0x0;
        uVar7 = *(long *)(stream + 8) * 4;
        puVar6[1] = uVar7;
        uVar3 = *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
        if (((uVar3 & 1) == 0) && ((uVar3 & 6) != 4)) goto code_r0x001222ee;
        uVar10 = 0;
        bVar12 = false;
        local_50 = status_io_error;
      }
    }
    else {
      contents = (void *)(*(code *)impl::(anonymous_namespace)::
                                   xml_memory_management_function_storage<int>::allocate)
                                   (uVar10 + 1);
      if (contents == (void *)0x0) goto LAB_001223b8;
      __dest = contents;
      if (puVar11 != (undefined8 *)0x0) {
        puVar9 = puVar11;
        do {
          if ((long)contents + uVar10 < (ulong)((long)__dest + puVar9[1])) {
            __assert_fail("write + chunk->size <= buffer + total",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                          ,0x1321,
                          "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_noseek(std::basic_istream<T> &, void **, size_t *) [T = wchar_t]"
                         );
          }
          memcpy(__dest,puVar9 + 2,puVar9[1]);
          __dest = (void *)((long)__dest + puVar9[1]);
          puVar9 = (undefined8 *)*puVar9;
        } while (puVar9 != (undefined8 *)0x0);
      }
      if (__dest != (void *)((long)contents + uVar10)) {
        __assert_fail("write == buffer + total",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x1326,
                      "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_noseek(std::basic_istream<T> &, void **, size_t *) [T = wchar_t]"
                     );
      }
      bVar12 = true;
      local_50 = status_ok;
    }
    goto LAB_001223c0;
  }
  auVar13 = std::wistream::tellg();
  lVar4 = auVar13._0_8_;
  local_50 = status_io_error;
  std::wistream::seekg((long)stream,_S_beg);
  lVar5 = std::wistream::tellg();
  std::wistream::seekg(stream,lVar4,auVar13._8_8_);
  if (-1 < lVar4 && ((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) == 0) {
    uVar10 = lVar5 - lVar4;
    local_50 = status_out_of_memory;
    if ((-1 < (long)uVar10) &&
       (contents = (void *)(*(code *)impl::(anonymous_namespace)::
                                     xml_memory_management_function_storage<int>::allocate)
                                     (uVar10 * 4 + 1),
       puVar1 = impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
       , contents != (void *)0x0)) {
      std::wistream::read((wchar_t *)stream,(long)contents);
      if ((*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 6) != 4 &&
          (*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 1) == 0) {
        if (uVar10 < *(ulong *)(stream + 8)) {
          __assert_fail("actual_length <= read_length",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                        ,0x134b,
                        "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_seek(std::basic_istream<T> &, void **, size_t *) [T = wchar_t]"
                       );
        }
        uVar10 = *(ulong *)(stream + 8) << 2;
        goto LAB_001223dd;
      }
      (*(code *)puVar1)(contents);
      local_50 = status_io_error;
    }
  }
  goto LAB_00122417;
code_r0x001222ee:
  uVar8 = uVar7 + uVar10;
  if (uVar7 + uVar10 <= uVar10) {
    uVar8 = uVar10;
  }
  bVar12 = CARRY8(uVar7,uVar10);
  puVar9 = puVar6;
  uVar10 = uVar8;
  if (bVar12) goto code_r0x0012230b;
  goto LAB_00122265;
code_r0x0012230b:
  uVar10 = 0;
  contents = (void *)0x0;
  bVar12 = false;
LAB_001223c0:
  while (puVar11 != (undefined8 *)0x0) {
    puVar9 = (undefined8 *)*puVar11;
    (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (puVar11);
    puVar11 = puVar9;
  }
  if (bVar12) {
LAB_001223dd:
    impl::anon_unknown_0::load_buffer_impl
              (__return_storage_ptr__,doc,(xml_node_struct *)doc,contents,uVar10,options,
               encoding_utf32_le,true,true,&this->_buffer);
    return __return_storage_ptr__;
  }
LAB_00122417:
  __return_storage_ptr__->encoding = encoding_auto;
  __return_storage_ptr__->status = local_50;
LAB_00122426:
  __return_storage_ptr__->offset = 0;
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xml_parse_result xml_document::load(std::basic_istream<wchar_t, std::char_traits<wchar_t> >& stream, unsigned int options)
	{
		reset();

		return impl::load_stream_impl(static_cast<impl::xml_document_struct*>(_root), stream, options, encoding_wchar, &_buffer);
	}